

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O1

void __thiscall CodeWriter::tag(CodeWriter *this,string *tag,bool isForEnd)

{
  std::__cxx11::string::_M_append((char *)this,(ulong)(tag->_M_dataplus)._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->tab)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->nop)._M_dataplus._M_p);
  std::__cxx11::string::_M_append((char *)this,(ulong)(this->newLine)._M_dataplus._M_p);
  return;
}

Assistant:

void CodeWriter::tag(const std::string &tag, bool isForEnd) {
    moonOutput += tag;
    moonOutput += tab;
    moonOutput += nop;
    moonOutput += newLine;
}